

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_char>::get_index<unsigned_char>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_char> *this,
          CImg<unsigned_char> *colormap,float dithering,bool map_indexes)

{
  byte bVar1;
  bool bVar2;
  int z;
  byte *pbVar3;
  float *pfVar4;
  CImgArgumentException *this_00;
  long lVar5;
  uint uVar6;
  uint *puVar7;
  uchar *puVar8;
  float *pfVar9;
  ulong uVar10;
  uint uVar11;
  uchar *ptrp0;
  byte *pbVar12;
  int iVar13;
  byte *pbVar14;
  float *pfVar15;
  float *pfVar16;
  ulong uVar17;
  long lVar18;
  float *pfVar19;
  uint *puVar20;
  uchar *_ptrs;
  uint uVar21;
  float *pfVar22;
  uchar *ptrp_end;
  uint *puVar23;
  long lVar24;
  uchar *puVar25;
  char *pcVar26;
  int x;
  int iVar27;
  long lVar28;
  byte *pbVar29;
  long lVar30;
  long lVar31;
  uchar *ptrp_end_3;
  byte *pbVar32;
  float *pfVar33;
  uint uVar34;
  uchar *ptrp0_1;
  byte *pbVar35;
  uint *puVar36;
  byte *pbVar37;
  Tfloat dist_1;
  Tfloat dist;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  uint *local_110;
  float *local_100;
  int local_f8;
  Tfloat valm;
  byte *local_e8;
  uint *local_e0;
  CImg<unsigned_int> *local_d8;
  CImg<unsigned_char> *local_d0;
  uint *local_c8;
  float local_bc;
  uchar *local_b8;
  float local_ac;
  float *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  uchar *local_88;
  uchar *local_80;
  uchar *local_78;
  CImg<float> cache;
  CImg<unsigned_char> local_50;
  
  local_d0 = colormap;
  if (colormap->_spectrum == this->_spectrum) {
    bVar2 = is_empty(this);
    if (bVar2) {
      __return_storage_ptr__->_data = (uint *)0x0;
      __return_storage_ptr__->_width = 0;
      __return_storage_ptr__->_height = 0;
      __return_storage_ptr__->_depth = 0;
      __return_storage_ptr__->_spectrum = 0;
      __return_storage_ptr__->_is_shared = false;
    }
    else {
      if (map_indexes) {
        uVar34 = this->_spectrum;
      }
      else {
        uVar34 = 1;
      }
      lVar31 = (ulong)this->_height * (ulong)this->_width * (ulong)this->_depth;
      lVar30 = (ulong)local_d0->_height * (ulong)local_d0->_width * (ulong)local_d0->_depth;
      local_d8 = __return_storage_ptr__;
      CImg<unsigned_int>::CImg
                (__return_storage_ptr__,this->_width,this->_height,this->_depth,uVar34);
      if (dithering <= 0.0) {
        uVar34 = this->_spectrum;
        __return_storage_ptr__ = local_d8;
        if (uVar34 == 1) {
          for (lVar31 = 0; lVar31 < (int)this->_depth; lVar31 = lVar31 + 1) {
            puVar36 = local_d8->_data;
            puVar25 = this->_data;
            for (lVar5 = 0; lVar5 < (int)this->_height; lVar5 = lVar5 + 1) {
              puVar20 = puVar36 + lVar5 * (ulong)local_d8->_width +
                                  (ulong)local_d8->_width * lVar31 * (ulong)local_d8->_height;
              uVar10 = (ulong)this->_width;
              pbVar12 = puVar25 + (ulong)this->_height * lVar31 * uVar10 + lVar5 * uVar10;
              pbVar37 = pbVar12 + uVar10;
              pbVar3 = local_d0->_data;
              for (; pbVar12 < pbVar37; pbVar12 = pbVar12 + 1) {
                pbVar35 = pbVar3;
                pbVar14 = pbVar3;
                fVar39 = 3.4028235e+38;
                while (fVar38 = fVar39, pbVar14 < pbVar3 + lVar30) {
                  fVar39 = ((float)*pbVar14 - (float)*pbVar12) * ((float)*pbVar14 - (float)*pbVar12)
                  ;
                  if (fVar39 < fVar38) {
                    pbVar35 = pbVar14;
                  }
                  pbVar14 = pbVar14 + 1;
                  if (fVar38 <= fVar39) {
                    fVar39 = fVar38;
                  }
                }
                if (map_indexes) {
                  uVar34 = (uint)*pbVar35;
                }
                else {
                  uVar34 = (int)pbVar35 - (int)pbVar3;
                }
                *puVar20 = uVar34;
                puVar20 = puVar20 + 1;
              }
            }
          }
        }
        else if (uVar34 == 3) {
          for (lVar5 = 0; lVar5 < (int)this->_depth; lVar5 = lVar5 + 1) {
            puVar36 = local_d8->_data;
            puVar25 = this->_data;
            for (lVar18 = 0; lVar18 < (int)this->_height; lVar18 = lVar18 + 1) {
              puVar20 = puVar36 + lVar18 * (ulong)local_d8->_width +
                                  (ulong)local_d8->_width * lVar5 * (ulong)local_d8->_height;
              puVar7 = puVar20 + lVar31;
              puVar23 = puVar7 + lVar31;
              uVar10 = (ulong)this->_width;
              pbVar35 = puVar25 + (ulong)this->_height * lVar5 * uVar10 + lVar18 * uVar10;
              pbVar3 = pbVar35 + lVar31;
              pbVar12 = pbVar3 + lVar31;
              pbVar14 = pbVar35 + uVar10;
              pbVar37 = local_d0->_data;
              for (; pbVar35 < pbVar14; pbVar35 = pbVar35 + 1) {
                pbVar32 = pbVar37;
                pbVar29 = pbVar37;
                fVar39 = 3.4028235e+38;
                while (fVar38 = fVar39, pbVar32 < pbVar37 + lVar30) {
                  fVar39 = ((float)pbVar32[lVar30 * 2] - (float)*pbVar12) *
                           ((float)pbVar32[lVar30 * 2] - (float)*pbVar12) +
                           ((float)*pbVar32 - (float)*pbVar35) * ((float)*pbVar32 - (float)*pbVar35)
                           + ((float)pbVar32[lVar30] - (float)*pbVar3) *
                             ((float)pbVar32[lVar30] - (float)*pbVar3);
                  if (fVar39 < fVar38) {
                    pbVar29 = pbVar32;
                  }
                  pbVar32 = pbVar32 + 1;
                  if (fVar38 <= fVar39) {
                    fVar39 = fVar38;
                  }
                }
                if (map_indexes) {
                  *puVar20 = (uint)*pbVar29;
                  *puVar7 = (uint)pbVar29[lVar30];
                  puVar7 = puVar7 + 1;
                  *puVar23 = (uint)pbVar29[lVar30 * 2];
                  puVar23 = puVar23 + 1;
                }
                else {
                  *puVar20 = (int)pbVar29 - (int)pbVar37;
                }
                pbVar3 = pbVar3 + 1;
                pbVar12 = pbVar12 + 1;
                puVar20 = puVar20 + 1;
              }
            }
          }
        }
        else if (uVar34 == 2) {
          for (lVar5 = 0; lVar5 < (int)this->_depth; lVar5 = lVar5 + 1) {
            puVar36 = local_d8->_data;
            puVar25 = this->_data;
            for (lVar18 = 0; lVar18 < (int)this->_height; lVar18 = lVar18 + 1) {
              puVar20 = puVar36 + lVar18 * (ulong)local_d8->_width +
                                  (ulong)local_d8->_width * lVar5 * (ulong)local_d8->_height;
              puVar7 = puVar20 + lVar31;
              uVar10 = (ulong)this->_width;
              pbVar37 = puVar25 + (ulong)this->_height * lVar5 * uVar10 + lVar18 * uVar10;
              pbVar3 = pbVar37 + lVar31;
              pbVar35 = pbVar37 + uVar10;
              pbVar12 = local_d0->_data;
              for (; pbVar37 < pbVar35; pbVar37 = pbVar37 + 1) {
                pbVar14 = pbVar12;
                pbVar32 = pbVar12;
                fVar39 = 3.4028235e+38;
                while (fVar38 = fVar39, pbVar32 < pbVar12 + lVar30) {
                  fVar39 = ((float)*pbVar32 - (float)*pbVar37) * ((float)*pbVar32 - (float)*pbVar37)
                           + ((float)pbVar32[lVar30] - (float)*pbVar3) *
                             ((float)pbVar32[lVar30] - (float)*pbVar3);
                  if (fVar39 < fVar38) {
                    pbVar14 = pbVar32;
                  }
                  pbVar32 = pbVar32 + 1;
                  if (fVar38 <= fVar39) {
                    fVar39 = fVar38;
                  }
                }
                if (map_indexes) {
                  *puVar20 = (uint)*pbVar14;
                  *puVar7 = (uint)pbVar14[lVar30];
                  puVar7 = puVar7 + 1;
                }
                else {
                  *puVar20 = (int)pbVar14 - (int)pbVar12;
                }
                pbVar3 = pbVar3 + 1;
                puVar20 = puVar20 + 1;
              }
            }
          }
        }
        else {
          for (lVar5 = 0; lVar5 < (int)this->_depth; lVar5 = lVar5 + 1) {
            puVar36 = local_d8->_data;
            puVar25 = this->_data;
            for (lVar18 = 0; lVar18 < (int)this->_height; lVar18 = lVar18 + 1) {
              puVar20 = puVar36 + lVar18 * (ulong)local_d8->_width +
                                  (ulong)local_d8->_width * lVar5 * (ulong)local_d8->_height;
              uVar10 = (ulong)this->_width;
              pbVar37 = puVar25 + (ulong)this->_height * lVar5 * uVar10 + lVar18 * uVar10;
              pbVar12 = pbVar37 + uVar10;
              pbVar3 = local_d0->_data;
              for (; pbVar37 < pbVar12; pbVar37 = pbVar37 + 1) {
                uVar34 = this->_spectrum;
                uVar11 = 0;
                if (0 < (int)uVar34) {
                  uVar11 = uVar34;
                }
                fVar39 = 3.4028235e+38;
                pbVar35 = pbVar3;
                for (pbVar14 = pbVar3; pbVar14 < pbVar3 + lVar30; pbVar14 = pbVar14 + 1) {
                  fVar38 = 0.0;
                  pbVar32 = pbVar37;
                  pbVar29 = pbVar14;
                  uVar6 = uVar11;
                  while (bVar2 = uVar6 != 0, uVar6 = uVar6 - 1, bVar2) {
                    fVar38 = fVar38 + ((float)*pbVar32 - (float)*pbVar29) *
                                      ((float)*pbVar32 - (float)*pbVar29);
                    pbVar32 = pbVar32 + lVar31;
                    pbVar29 = pbVar29 + lVar30;
                  }
                  pbVar32 = pbVar14;
                  if (fVar39 <= fVar38) {
                    pbVar32 = pbVar35;
                    fVar38 = fVar39;
                  }
                  fVar39 = fVar38;
                  pbVar35 = pbVar32;
                }
                if (map_indexes) {
                  puVar7 = puVar20;
                  for (iVar27 = 0; iVar27 < (int)uVar34; iVar27 = iVar27 + 1) {
                    *puVar7 = (uint)*pbVar35;
                    pbVar35 = pbVar35 + lVar30;
                    uVar34 = this->_spectrum;
                    puVar7 = puVar7 + lVar31;
                  }
                }
                else {
                  local_110._0_4_ = (int)pbVar3;
                  *puVar20 = (int)pbVar35 - (int)local_110;
                }
                puVar20 = puVar20 + 1;
              }
            }
          }
        }
      }
      else {
        puVar36 = __return_storage_ptr__->_data;
        valm = 0.0;
        pbVar3 = max_min<float>(this,&valm);
        local_ac = (float)*pbVar3;
        if ((valm == local_ac) && (0.0 <= valm)) {
          valm = 0.0;
          local_ac = 255.0;
        }
        get_crop(&local_50,this,-1,0,0,0,this->_width,1,0,this->_spectrum - 1,0);
        CImg<float>::CImg<unsigned_char>(&cache,&local_50);
        local_bc = 1.0;
        if (dithering <= 1.0) {
          local_bc = dithering;
        }
        local_bc = local_bc * 0.0625;
        ~CImg(&local_50);
        pfVar33 = cache._data + (ulong)cache._width + 1;
        local_100 = cache._data + 1;
        lVar5 = (ulong)cache._height * (ulong)cache._width * (ulong)cache._depth;
        uVar34 = this->_spectrum;
        if (uVar34 == 3) {
          local_e0 = puVar36 + lVar31;
          local_c8 = local_e0 + lVar31;
          local_90 = lVar31 * 2;
          lVar18 = 0;
          while (lVar28 = lVar18, lVar28 < (int)this->_depth) {
            local_78 = this->_data;
            local_80 = local_78 + local_90;
            local_88 = local_78 + lVar31;
            local_98 = 1;
            puVar25 = (uchar *)0x0;
            pfVar4 = pfVar33;
            while( true ) {
              pfVar33 = pfVar4;
              puVar8 = puVar25;
              uVar34 = this->_height;
              if ((long)(int)uVar34 <= (long)puVar8) break;
              if ((long)puVar8 < (long)(int)uVar34 + -2) {
                uVar11 = this->_width;
                uVar6 = 0;
                if (0 < (int)uVar11) {
                  uVar6 = uVar11;
                }
                lVar18 = ((ulong)uVar34 * lVar28 + local_98) * (ulong)uVar11;
                for (lVar24 = 0; uVar6 != (uint)lVar24; lVar24 = lVar24 + 1) {
                  pfVar33[lVar24] = (float)local_78[lVar24 + lVar18];
                  pfVar33[lVar5 + lVar24] = (float)local_88[lVar24 + lVar18];
                  pfVar33[lVar5 * 2 + lVar24] = (float)local_80[lVar24 + lVar18];
                }
              }
              pfVar4 = pfVar33 + lVar5;
              pfVar16 = local_100 + lVar5;
              pfVar22 = pfVar16 + lVar5;
              pfVar19 = pfVar4 + lVar5;
              pbVar3 = local_d0->_data;
              pfVar9 = local_100;
              pfVar15 = pfVar33;
              for (iVar27 = 0; iVar27 < (int)this->_width; iVar27 = iVar27 + 1) {
                fVar39 = *pfVar9;
                fVar38 = local_ac;
                if (fVar39 <= local_ac) {
                  fVar38 = fVar39;
                }
                fVar40 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                ~-(uint)(fVar39 < valm) & (uint)fVar38);
                fVar39 = *pfVar16;
                fVar38 = local_ac;
                if (fVar39 <= local_ac) {
                  fVar38 = fVar39;
                }
                fVar38 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                ~-(uint)(fVar39 < valm) & (uint)fVar38);
                fVar39 = *pfVar22;
                fVar42 = local_ac;
                if (fVar39 <= local_ac) {
                  fVar42 = fVar39;
                }
                fVar39 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                ~-(uint)(fVar39 < valm) & (uint)fVar42);
                pbVar12 = pbVar3;
                pbVar37 = pbVar3;
                fVar42 = 3.4028235e+38;
                while (fVar41 = fVar42, pbVar37 < pbVar3 + lVar30) {
                  fVar42 = ((float)pbVar37[lVar30 * 2] - fVar39) *
                           ((float)pbVar37[lVar30 * 2] - fVar39) +
                           ((float)*pbVar37 - fVar40) * ((float)*pbVar37 - fVar40) +
                           ((float)pbVar37[lVar30] - fVar38) * ((float)pbVar37[lVar30] - fVar38);
                  if (fVar42 < fVar41) {
                    pbVar12 = pbVar37;
                  }
                  pbVar37 = pbVar37 + 1;
                  if (fVar41 <= fVar42) {
                    fVar42 = fVar41;
                  }
                }
                local_e8 = (byte *)CONCAT44(local_e8._4_4_,iVar27);
                *pfVar9 = fVar40;
                bVar1 = *pbVar12;
                *pfVar16 = fVar38;
                fVar40 = (fVar40 - (float)bVar1) * local_bc;
                fVar38 = (fVar38 - (float)pbVar12[lVar30]) * local_bc;
                *pfVar22 = fVar39;
                fVar39 = (fVar39 - (float)pbVar12[lVar30 * 2]) * local_bc;
                pfVar9[1] = fVar40 * 7.0 + pfVar9[1];
                pfVar16[1] = fVar38 * 7.0 + pfVar16[1];
                pfVar22[1] = fVar39 * 7.0 + pfVar22[1];
                pfVar15[-1] = fVar40 * 3.0 + pfVar15[-1];
                pfVar4[-1] = fVar38 * 3.0 + pfVar4[-1];
                pfVar19[-1] = fVar39 * 3.0 + pfVar19[-1];
                *pfVar15 = fVar40 * 5.0 + *pfVar15;
                *pfVar4 = fVar38 * 5.0 + *pfVar4;
                *pfVar19 = fVar39 * 5.0 + *pfVar19;
                pfVar15[1] = fVar40 + pfVar15[1];
                pfVar4[1] = fVar38 + pfVar4[1];
                pfVar19[1] = fVar39 + pfVar19[1];
                if (map_indexes) {
                  *puVar36 = (uint)*pbVar12;
                  *local_e0 = (uint)pbVar12[lVar30];
                  local_e0 = local_e0 + 1;
                  *local_c8 = (uint)pbVar12[lVar30 * 2];
                  local_c8 = local_c8 + 1;
                }
                else {
                  local_f8 = (int)pbVar3;
                  *puVar36 = (int)pbVar12 - local_f8;
                }
                pfVar9 = pfVar9 + 1;
                pfVar16 = pfVar16 + 1;
                pfVar22 = pfVar22 + 1;
                pfVar15 = pfVar15 + 1;
                pfVar4 = pfVar4 + 1;
                pfVar19 = pfVar19 + 1;
                puVar36 = puVar36 + 1;
              }
              local_98 = local_98 + 1;
              puVar25 = puVar8 + 1;
              pfVar4 = local_100;
              local_100 = pfVar33;
              local_b8 = puVar8;
              local_a8 = pfVar33;
            }
            local_a0 = lVar28;
            lVar18 = lVar28 + 1;
          }
        }
        else if (uVar34 == 2) {
          local_110 = puVar36 + lVar31;
          puVar20 = (uint *)0x0;
          while (puVar7 = puVar20, (long)puVar7 < (long)(int)this->_depth) {
            local_b8 = this->_data;
            local_a8 = (float *)(local_b8 + lVar31);
            local_e0 = (uint *)0x1;
            pbVar3 = (byte *)0x0;
            pfVar4 = pfVar33;
            while( true ) {
              pfVar33 = pfVar4;
              pbVar12 = pbVar3;
              uVar34 = this->_height;
              if ((long)(int)uVar34 <= (long)pbVar12) break;
              if ((long)pbVar12 < (long)(int)uVar34 + -2) {
                uVar11 = this->_width;
                uVar6 = 0;
                if (0 < (int)uVar11) {
                  uVar6 = uVar11;
                }
                lVar18 = (long)((ulong)uVar34 * (long)puVar7 + (long)local_e0) * (ulong)uVar11;
                for (lVar28 = 0; uVar6 != (uint)lVar28; lVar28 = lVar28 + 1) {
                  pfVar33[lVar28] = (float)local_b8[lVar28 + lVar18];
                  pfVar33[lVar5 + lVar28] = (float)*(byte *)((long)local_a8 + lVar28 + lVar18);
                }
              }
              pfVar4 = pfVar33 + lVar5;
              pfVar16 = local_100 + lVar5;
              pbVar3 = local_d0->_data;
              pfVar22 = pfVar33;
              pfVar19 = local_100;
              for (iVar27 = 0; iVar27 < (int)this->_width; iVar27 = iVar27 + 1) {
                fVar39 = *pfVar19;
                fVar38 = local_ac;
                if (fVar39 <= local_ac) {
                  fVar38 = fVar39;
                }
                fVar38 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                ~-(uint)(fVar39 < valm) & (uint)fVar38);
                fVar39 = *pfVar16;
                fVar40 = local_ac;
                if (fVar39 <= local_ac) {
                  fVar40 = fVar39;
                }
                fVar40 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                ~-(uint)(fVar39 < valm) & (uint)fVar40);
                pbVar37 = pbVar3;
                pbVar35 = pbVar3;
                fVar39 = 3.4028235e+38;
                while (fVar42 = fVar39, pbVar35 < pbVar3 + lVar30) {
                  fVar39 = ((float)*pbVar35 - fVar38) * ((float)*pbVar35 - fVar38) +
                           ((float)pbVar35[lVar30] - fVar40) * ((float)pbVar35[lVar30] - fVar40);
                  if (fVar39 < fVar42) {
                    pbVar37 = pbVar35;
                  }
                  pbVar35 = pbVar35 + 1;
                  if (fVar42 <= fVar39) {
                    fVar39 = fVar42;
                  }
                }
                *pfVar19 = fVar38;
                fVar39 = (fVar38 - (float)*pbVar37) * local_bc;
                *pfVar16 = fVar40;
                fVar38 = (fVar40 - (float)pbVar37[lVar30]) * local_bc;
                pfVar19[1] = fVar39 * 7.0 + pfVar19[1];
                pfVar16[1] = fVar38 * 7.0 + pfVar16[1];
                pfVar22[-1] = fVar39 * 3.0 + pfVar22[-1];
                pfVar4[-1] = fVar38 * 3.0 + pfVar4[-1];
                *pfVar22 = fVar39 * 5.0 + *pfVar22;
                *pfVar4 = fVar38 * 5.0 + *pfVar4;
                pfVar22[1] = fVar39 + pfVar22[1];
                pfVar4[1] = fVar38 + pfVar4[1];
                if (map_indexes) {
                  *puVar36 = (uint)*pbVar37;
                  *local_110 = (uint)pbVar37[lVar30];
                  local_110 = local_110 + 1;
                }
                else {
                  *puVar36 = (int)pbVar37 - (int)pbVar3;
                }
                pfVar19 = pfVar19 + 1;
                pfVar16 = pfVar16 + 1;
                pfVar22 = pfVar22 + 1;
                pfVar4 = pfVar4 + 1;
                puVar36 = puVar36 + 1;
              }
              local_e0 = (uint *)((long)local_e0 + 1);
              pbVar3 = pbVar12 + 1;
              pfVar4 = local_100;
              local_100 = pfVar33;
              local_e8 = pbVar12;
            }
            local_c8 = puVar7;
            puVar20 = (uint *)((long)puVar7 + 1);
          }
        }
        else if (uVar34 == 1) {
          for (lVar31 = 0; lVar31 < (int)this->_depth; lVar31 = lVar31 + 1) {
            puVar25 = this->_data;
            lVar5 = 1;
            lVar18 = 0;
            pfVar4 = pfVar33;
            while( true ) {
              pfVar33 = pfVar4;
              uVar34 = this->_height;
              if ((int)uVar34 <= lVar18) break;
              if (lVar18 < (long)(int)uVar34 + -2) {
                uVar11 = this->_width;
                uVar6 = 0;
                if (0 < (int)uVar11) {
                  uVar6 = uVar11;
                }
                for (lVar28 = 0; uVar6 != (uint)lVar28; lVar28 = lVar28 + 1) {
                  pfVar33[lVar28] =
                       (float)puVar25[lVar28 + ((ulong)uVar34 * lVar31 + lVar5) * (ulong)uVar11];
                }
              }
              pbVar3 = local_d0->_data;
              pfVar4 = local_100;
              pfVar16 = pfVar33;
              for (iVar27 = 0; iVar27 < (int)this->_width; iVar27 = iVar27 + 1) {
                fVar39 = *pfVar4;
                fVar38 = local_ac;
                if (fVar39 <= local_ac) {
                  fVar38 = fVar39;
                }
                fVar38 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                ~-(uint)(fVar39 < valm) & (uint)fVar38);
                pbVar12 = pbVar3;
                pbVar37 = pbVar3;
                fVar39 = 3.4028235e+38;
                while (fVar40 = fVar39, pbVar12 < pbVar3 + lVar30) {
                  fVar39 = ((float)*pbVar12 - fVar38) * ((float)*pbVar12 - fVar38);
                  if (fVar39 < fVar40) {
                    pbVar37 = pbVar12;
                  }
                  pbVar12 = pbVar12 + 1;
                  if (fVar40 <= fVar39) {
                    fVar39 = fVar40;
                  }
                }
                *pfVar4 = fVar38;
                fVar39 = (fVar38 - (float)*pbVar37) * local_bc;
                pfVar4[1] = fVar39 * 7.0 + pfVar4[1];
                pfVar16[-1] = fVar39 * 3.0 + pfVar16[-1];
                *pfVar16 = fVar39 * 5.0 + *pfVar16;
                pfVar16[1] = fVar39 + pfVar16[1];
                if (map_indexes) {
                  uVar34 = (uint)*pbVar37;
                }
                else {
                  uVar34 = (int)pbVar37 - (int)pbVar3;
                }
                pfVar4 = pfVar4 + 1;
                pfVar16 = pfVar16 + 1;
                *puVar36 = uVar34;
                puVar36 = puVar36 + 1;
              }
              lVar18 = lVar18 + 1;
              lVar5 = lVar5 + 1;
              pfVar4 = local_100;
              local_100 = pfVar33;
            }
          }
        }
        else {
          puVar25 = (uchar *)0x0;
          while (puVar8 = puVar25, (long)puVar8 < (long)(int)this->_depth) {
            local_c8 = (uint *)0x1;
            puVar20 = (uint *)0x0;
            pfVar4 = pfVar33;
            while( true ) {
              pfVar33 = pfVar4;
              puVar7 = puVar20;
              uVar34 = this->_height;
              if ((long)(int)uVar34 <= (long)puVar7) break;
              if ((long)puVar7 < (long)(int)uVar34 + -2) {
                uVar11 = this->_width;
                uVar6 = this->_depth;
                uVar21 = 0;
                if (0 < (int)uVar11) {
                  uVar21 = uVar11;
                }
                uVar10 = (ulong)this->_spectrum;
                if ((int)this->_spectrum < 1) {
                  uVar10 = 0;
                }
                puVar25 = this->_data +
                          (long)((long)puVar8 * (ulong)uVar34 + (long)local_c8) * (ulong)uVar11;
                pfVar4 = pfVar33;
                for (uVar17 = 0; uVar17 != uVar10; uVar17 = uVar17 + 1) {
                  for (lVar18 = 0; uVar21 != (uint)lVar18; lVar18 = lVar18 + 1) {
                    pfVar4[lVar18] = (float)puVar25[lVar18];
                  }
                  pfVar4 = pfVar4 + lVar5;
                  puVar25 = puVar25 + (ulong)uVar6 * (ulong)uVar11 * (ulong)uVar34;
                }
              }
              local_e8 = local_d0->_data;
              pfVar4 = local_100;
              pfVar16 = pfVar33;
              for (iVar27 = 0; iVar27 < (int)this->_width; iVar27 = iVar27 + 1) {
                uVar34 = this->_spectrum;
                if ((int)this->_spectrum < 1) {
                  uVar34 = 0;
                }
                fVar39 = 3.4028235e+38;
                pbVar3 = local_e8;
                for (pbVar12 = local_e8; pbVar12 < local_e8 + lVar30; pbVar12 = pbVar12 + 1) {
                  fVar38 = 0.0;
                  pfVar22 = pfVar4;
                  pbVar37 = pbVar12;
                  uVar11 = uVar34;
                  while (bVar2 = uVar11 != 0, uVar11 = uVar11 - 1, bVar2) {
                    fVar40 = *pfVar22;
                    fVar42 = local_ac;
                    if (fVar40 <= local_ac) {
                      fVar42 = fVar40;
                    }
                    fVar40 = (float)(-(uint)(fVar40 < valm) & (uint)valm |
                                    ~-(uint)(fVar40 < valm) & (uint)fVar42);
                    *pfVar22 = fVar40;
                    fVar40 = fVar40 - (float)*pbVar37;
                    fVar38 = fVar38 + fVar40 * fVar40;
                    pbVar37 = pbVar37 + lVar30;
                    pfVar22 = pfVar22 + lVar5;
                  }
                  pbVar37 = pbVar12;
                  if (fVar39 <= fVar38) {
                    fVar38 = fVar39;
                    pbVar37 = pbVar3;
                  }
                  pbVar3 = pbVar37;
                  fVar39 = fVar38;
                }
                uVar34 = this->_spectrum;
                if ((int)this->_spectrum < 1) {
                  uVar34 = 0;
                }
                lVar18 = 4;
                pbVar12 = pbVar3;
                while (bVar2 = uVar34 != 0, uVar34 = uVar34 - 1, bVar2) {
                  fVar38 = (*(float *)((long)pfVar4 + lVar18 + -4) - (float)*pbVar12) * local_bc;
                  *(float *)((long)pfVar4 + lVar18) =
                       fVar38 * 7.0 + *(float *)((long)pfVar4 + lVar18);
                  pfVar22 = (float *)((long)pfVar16 + lVar18 + -8);
                  fVar39 = pfVar22[1];
                  pfVar19 = (float *)((long)pfVar16 + lVar18 + -8);
                  *pfVar19 = fVar38 * 3.0 + *pfVar22;
                  pfVar19[1] = fVar38 * 5.0 + fVar39;
                  *(float *)((long)pfVar16 + lVar18) = fVar38 + *(float *)((long)pfVar16 + lVar18);
                  pbVar12 = pbVar12 + lVar30;
                  lVar18 = lVar18 + lVar5 * 4;
                }
                if (map_indexes) {
                  puVar20 = puVar36;
                  for (iVar13 = 0; iVar13 < (int)this->_spectrum; iVar13 = iVar13 + 1) {
                    *puVar20 = (uint)*pbVar3;
                    pbVar3 = pbVar3 + lVar30;
                    puVar20 = puVar20 + lVar31;
                  }
                }
                else {
                  *puVar36 = (int)pbVar3 - (int)local_e8;
                }
                pfVar16 = pfVar16 + 1;
                puVar36 = puVar36 + 1;
                pfVar4 = pfVar4 + 1;
              }
              local_c8 = (uint *)((long)local_c8 + 1);
              puVar20 = (uint *)((long)puVar7 + 1);
              pfVar4 = local_100;
              local_100 = pfVar33;
              local_e0 = puVar7;
            }
            local_b8 = puVar8;
            puVar25 = puVar8 + 1;
          }
        }
        CImg<float>::~CImg(&cache);
        __return_storage_ptr__ = local_d8;
      }
    }
    return __return_storage_ptr__;
  }
  this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
  pcVar26 = "non-";
  if (this->_is_shared != false) {
    pcVar26 = "";
  }
  CImgArgumentException::CImgArgumentException
            (this_00,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::index(): Instance and specified colormap (%u,%u,%u,%u,%p) have incompatible dimensions."
             ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar26,"unsigned char",(ulong)local_d0->_width,(ulong)local_d0->_height,
             (ulong)local_d0->_depth,(ulong)local_d0->_spectrum,local_d0->_data);
  __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
}

Assistant:

CImg<typename CImg<t>::Tuint>
    get_index(const CImg<t>& colormap, const float dithering=1, const bool map_indexes=true) const {
      if (colormap._spectrum!=_spectrum)
        throw CImgArgumentException(_cimg_instance
                                    "index(): Instance and specified colormap (%u,%u,%u,%u,%p) "
                                    "have incompatible dimensions.",
                                    cimg_instance,
                                    colormap._width,colormap._height,colormap._depth,colormap._spectrum,colormap._data);

      typedef typename CImg<t>::Tuint tuint;
      if (is_empty()) return CImg<tuint>();
      const ulongT
        whd = (ulongT)_width*_height*_depth,
        pwhd = (ulongT)colormap._width*colormap._height*colormap._depth;
      CImg<tuint> res(_width,_height,_depth,map_indexes?_spectrum:1);
      if (dithering>0) { // Dithered versions
        tuint *ptrd = res._data;
        const float ndithering = cimg::cut(dithering,0,1)/16;
        Tfloat valm = 0, valM = (Tfloat)max_min(valm);
        if (valm==valM && valm>=0 && valM<=255) { valm = 0; valM = 255; }
        CImg<Tfloat> cache = get_crop(-1,0,0,0,_width,1,0,_spectrum - 1);
        Tfloat *cache_current = cache.data(1,0,0,0), *cache_next = cache.data(1,1,0,0);
        const ulongT cwhd = (ulongT)cache._width*cache._height*cache._depth;
        switch (_spectrum) {
        case 1 : { // Optimized for scalars
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc0 = cache_next; const T *ptrs0 = data(0,y + 1,z,0);
              cimg_forX(*this,x) *(ptrc0++) = (Tfloat)*(ptrs0++);
            }
            Tfloat *ptrs0 = cache_current, *ptrsn0 = cache_next;
            cimg_forX(*this,x) {
              const Tfloat _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp_end = ptrp0 + pwhd; ptrp0<ptrp_end; ) {
                const Tfloat pval0 = (Tfloat)*(ptrp0++) - val0, dist = pval0*pval0;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const Tfloat err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering;
              *ptrs0+=7*err0; *(ptrsn0 - 1)+=3*err0; *(ptrsn0++)+=5*err0; *ptrsn0+=err0;
              if (map_indexes) *(ptrd++) = (tuint)*ptrmin0; else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 2 : { // Optimized for 2D vectors
          tuint *ptrd1 = ptrd + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd;
              const T *ptrs0 = data(0,y + 1,z,0), *ptrs1 = ptrs0 + whd;
              cimg_forX(*this,x) { *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0, pval1 = (Tfloat)*(ptrp1++) - val1,
                  dist = pval0*pval0 + pval1*pval1;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering;
              *ptrs0+=7*err0; *ptrs1+=7*err1;
              *(ptrsn0 - 1)+=3*err0; *(ptrsn1 - 1)+=3*err1;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1;
              *ptrsn0+=err0; *ptrsn1+=err1;
              if (map_indexes) { *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; }
              else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 3 : { // Optimized for 3D vectors (colors)
          tuint *ptrd1 = ptrd + whd, *ptrd2 = ptrd1 + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd, *ptrc2 = ptrc1 + cwhd;
              const T *ptrs0 = data(0,y + 1,z,0), *ptrs1 = ptrs0 + whd, *ptrs2 = ptrs1 + whd;
              cimg_forX(*this,x) {
                *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); *(ptrc2++) = (Tfloat)*(ptrs2++);
              }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd, *ptrs2 = ptrs1 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd, *ptrsn2 = ptrsn1 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1,
                _val2 = (Tfloat)*ptrs2, val2 = _val2<valm?valm:_val2>valM?valM:_val2;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp2 = ptrp1 + pwhd,
                     *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0,
                  pval1 = (Tfloat)*(ptrp1++) - val1,
                  pval2 = (Tfloat)*(ptrp2++) - val2,
                  dist = pval0*pval0 + pval1*pval1 + pval2*pval2;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd, *const ptrmin2 = ptrmin1 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering,
                err2 = ((*(ptrs2++)=val2) - (Tfloat)*ptrmin2)*ndithering;

              *ptrs0+=7*err0; *ptrs1+=7*err1; *ptrs2+=7*err2;
              *(ptrsn0 - 1)+=3*err0; *(ptrsn1 - 1)+=3*err1; *(ptrsn2 - 1)+=3*err2;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1; *(ptrsn2++)+=5*err2;
              *ptrsn0+=err0; *ptrsn1+=err1; *ptrsn2+=err2;

              if (map_indexes) {
                *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; *(ptrd2++) = (tuint)*ptrmin2;
              } else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        default : // Generic version
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc = cache_next;
              cimg_forC(*this,c) {
                Tfloat *_ptrc = ptrc; const T *_ptrs = data(0,y + 1,z,c);
                cimg_forX(*this,x) *(_ptrc++) = (Tfloat)*(_ptrs++);
                ptrc+=cwhd;
              }
            }
            Tfloat *ptrs = cache_current, *ptrsn = cache_next;
            cimg_forX(*this,x) {
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin = colormap._data;
              for (const t *ptrp = colormap._data, *ptrp_end = ptrp + pwhd; ptrp<ptrp_end; ++ptrp) {
                Tfloat dist = 0; Tfloat *_ptrs = ptrs; const t *_ptrp = ptrp;
                cimg_forC(*this,c) {
                  const Tfloat _val = *_ptrs, val = _val<valm?valm:_val>valM?valM:_val;
                  dist+=cimg::sqr((*_ptrs=val) - (Tfloat)*_ptrp); _ptrs+=cwhd; _ptrp+=pwhd;
                }
                if (dist<distmin) { ptrmin = ptrp; distmin = dist; }
              }
              const t *_ptrmin = ptrmin; Tfloat *_ptrs = ptrs++, *_ptrsn = (ptrsn++) - 1;
              cimg_forC(*this,c) {
                const Tfloat err = (*(_ptrs++) - (Tfloat)*_ptrmin)*ndithering;
                *_ptrs+=7*err; *(_ptrsn++)+=3*err; *(_ptrsn++)+=5*err; *_ptrsn+=err;
                _ptrmin+=pwhd; _ptrs+=cwhd - 1; _ptrsn+=cwhd - 2;
              }
              if (map_indexes) {
                tuint *_ptrd = ptrd++;
                cimg_forC(*this,c) { *_ptrd = (tuint)*ptrmin; _ptrd+=whd; ptrmin+=pwhd; }
              }
              else *(ptrd++) = (tuint)(ptrmin - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        }